

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O3

Status __thiscall
leveldb::Table::Open
          (Table *this,Options *options,RandomAccessFile *file,uint64_t size,Table **table)

{
  Rep *pRVar1;
  Block *this_00;
  Rep *pRVar2;
  uint64_t uVar3;
  Table *this_01;
  BlockContents index_block_contents;
  ReadOptions opt;
  Footer footer;
  Slice footer_input;
  char footer_space [48];
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  Footer local_a8;
  Rep *local_80;
  char *local_78;
  undefined8 local_70;
  Slice local_68 [3];
  
  *table = (Table *)0x0;
  if (size < 0x30) {
    local_68[0].data_ = "file is too short to be an sstable";
    local_68[0].size_ = 0x22;
    local_a8.metaindex_handle_.offset_ = 0x10f129;
    local_a8.metaindex_handle_.size_ = 0;
    Status::Status((Status *)this,kCorruption,local_68,(Slice *)&local_a8);
  }
  else {
    local_78 = "";
    local_70 = 0;
    (*file->_vptr_RandomAccessFile[2])(this,file,size - 0x30,0x30,&local_78,local_68);
    if (this->rep_ == (Rep *)0x0) {
      local_a8.index_handle_.offset_._0_4_ = 0xffffffff;
      local_a8.index_handle_.offset_._4_4_ = 0xffffffff;
      local_a8.index_handle_.size_._0_4_ = 0xffffffff;
      local_a8.index_handle_.size_._4_4_ = 0xffffffff;
      local_a8.metaindex_handle_.offset_ = 0xffffffffffffffff;
      local_a8.metaindex_handle_.size_ = 0xffffffffffffffff;
      Footer::DecodeFrom((Footer *)local_d8,(Slice *)&local_a8);
      pRVar2 = this->rep_;
      this->rep_ = (Rep *)local_d8._0_8_;
      if (pRVar2 != (Rep *)0x0) {
        local_d8._0_8_ = pRVar2;
        operator_delete__(pRVar2);
        local_d8._0_8_ = this->rep_;
      }
      if ((Rep *)local_d8._0_8_ == (Rep *)0x0) {
        local_d8._0_8_ = "";
        local_d8._8_8_ = 0;
        local_d8._24_2_ = 0x100;
        local_b8 = (undefined1  [16])0x0;
        if (options->paranoid_checks == true) {
          local_d8._24_2_ = 0x101;
        }
        ReadBlock((leveldb *)&local_80,file,options,(ReadOptions *)(local_d8 + 0x18),
                  &local_a8.index_handle_,(BlockContents *)local_d8);
        pRVar2 = this->rep_;
        this->rep_ = local_80;
        pRVar1 = local_80;
        local_80 = pRVar2;
        if (pRVar2 != (Rep *)0x0) {
          operator_delete__(pRVar2);
          pRVar1 = this->rep_;
        }
        if (pRVar1 == (Rep *)0x0) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,(BlockContents *)local_d8);
          pRVar2 = (Rep *)operator_new(0x8a0);
          Options::Options((Options *)pRVar2);
          (pRVar2->status).state_ = (char *)0x0;
          memcpy(pRVar2,options,0x860);
          pRVar2->file = file;
          (pRVar2->metaindex_handle).offset_ = local_a8.metaindex_handle_.offset_;
          (pRVar2->metaindex_handle).size_ = local_a8.metaindex_handle_.size_;
          pRVar2->index_block = this_00;
          if (options->block_cache == (Cache *)0x0) {
            uVar3 = 0;
          }
          else {
            uVar3 = (**(code **)(*(long *)options->block_cache + 0x38))();
          }
          pRVar2->cache_id = uVar3;
          pRVar2->filter = (FilterBlockReader *)0x0;
          pRVar2->filter_data = (char *)0x0;
          this_01 = (Table *)operator_new(8);
          this_01->rep_ = pRVar2;
          *table = this_01;
          ReadMeta(this_01,&local_a8);
        }
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status Table::Open(const Options& options, RandomAccessFile* file,
                   uint64_t size, Table** table) {
  *table = nullptr;
  if (size < Footer::kEncodedLength) {
    return Status::Corruption("file is too short to be an sstable");
  }

  char footer_space[Footer::kEncodedLength];
  Slice footer_input;
  Status s = file->Read(size - Footer::kEncodedLength, Footer::kEncodedLength,
                        &footer_input, footer_space);
  if (!s.ok()) return s;

  Footer footer;
  s = footer.DecodeFrom(&footer_input);
  if (!s.ok()) return s;

  // Read the index block
  BlockContents index_block_contents;
  if (s.ok()) {
    ReadOptions opt;
    if (options.paranoid_checks) {
      opt.verify_checksums = true;
    }
    s = ReadBlock(file, options, opt, footer.index_handle(), &index_block_contents);
  }

  if (s.ok()) {
    // We've successfully read the footer and the index block: we're
    // ready to serve requests.
    Block* index_block = new Block(index_block_contents);
    Rep* rep = new Table::Rep;
    rep->options = options;
    rep->file = file;
    rep->metaindex_handle = footer.metaindex_handle();
    rep->index_block = index_block;
    rep->cache_id = (options.block_cache ? options.block_cache->NewId() : 0);
    rep->filter_data = nullptr;
    rep->filter = nullptr;
    *table = new Table(rep);
    (*table)->ReadMeta(footer);
  }

  return s;
}